

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cpp
# Opt level: O1

bool slang::matches(string_view str,string_view pattern)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  size_t sVar8;
  bool bVar9;
  string_view pattern_00;
  string_view pattern_01;
  string_view str_00;
  string_view str_01;
  
  pcVar5 = str._M_str;
  uVar4 = str._M_len;
  pcVar7 = pattern._M_str;
  sVar8 = pattern._M_len;
  uVar3 = uVar4;
  if (sVar8 != 0) {
    uVar3 = uVar4 - sVar8;
    uVar6 = uVar4;
    do {
      uVar6 = uVar6 - 1;
      cVar1 = *pcVar7;
      if (cVar1 == '*') {
        sVar8 = sVar8 - 1;
        if (sVar8 == 0) {
          return true;
        }
        bVar9 = uVar4 != 0;
        if (bVar9) {
          pattern_00._M_str = pcVar7 + 1;
          pattern_00._M_len = sVar8;
          str_00._M_str = pcVar5;
          str_00._M_len = uVar4;
          bVar2 = matches(str_00,pattern_00);
          if (bVar2) {
            return bVar9;
          }
          uVar3 = 1;
          do {
            bVar9 = uVar3 < uVar4;
            if (!bVar9) {
              return bVar9;
            }
            pattern_01._M_str = pcVar7 + 1;
            pattern_01._M_len = sVar8;
            str_01._M_str = pcVar5 + uVar3;
            str_01._M_len = uVar6;
            bVar2 = matches(str_01,pattern_01);
            uVar3 = uVar3 + 1;
            uVar6 = uVar6 - 1;
          } while (!bVar2);
          return bVar9;
        }
        return bVar9;
      }
      bVar9 = uVar4 == 0;
      uVar4 = uVar4 - 1;
      if ((bVar9) || ((cVar1 != '?' && (*pcVar5 != cVar1)))) {
        return false;
      }
      pcVar5 = pcVar5 + 1;
      pcVar7 = pcVar7 + 1;
      sVar8 = sVar8 - 1;
    } while (sVar8 != 0);
  }
  return uVar3 == 0;
}

Assistant:

static bool matches(std::string_view str, std::string_view pattern) {
    while (true) {
        // Empty pattern matches empty string.
        if (pattern.empty())
            return str.empty();

        // If next pattern char is '*' try to match pattern[1..] against
        // all possible tail strings of str to see if at least one succeeds.
        if (pattern[0] == '*') {
            // Simple case: if pattern is just '*' it matches anything.
            pattern = pattern.substr(1);
            if (pattern.empty())
                return true;

            for (size_t i = 0, end = str.size(); i < end; i++) {
                if (matches(str.substr(i), pattern))
                    return true;
            }
            return false;
        }

        // If pattern char isn't '*' then it must consume one character.
        if (str.empty())
            return false;

        // '?' matches any character, otherwise we need exact match.
        if (str[0] != pattern[0] && pattern[0] != '?')
            return false;

        str = str.substr(1);
        pattern = pattern.substr(1);
    }
}